

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::AddIfExists(cmCTest *this,Part part,char *file)

{
  bool bVar1;
  string name;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,file,&local_41);
  bVar1 = CTestFileExists(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    AddSubmitFile(this,part,file);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,file,&local_41);
    std::__cxx11::string::append((char *)&local_40);
    bVar1 = CTestFileExists(this,&local_40);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_40);
      return false;
    }
    AddSubmitFile(this,part,file);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return true;
}

Assistant:

bool cmCTest::AddIfExists(Part part, const char* file)
{
  if ( this->CTestFileExists(file) )
    {
    this->AddSubmitFile(part, file);
    }
  else
    {
    std::string name = file;
    name += ".gz";
    if ( this->CTestFileExists(name) )
      {
      this->AddSubmitFile(part, file);
      }
    else
      {
      return false;
      }
    }
  return true;
}